

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  Geometry *pGVar10;
  RTCIntersectArguments *pRVar11;
  RTCRayQueryContext *pRVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 (*pauVar26) [16];
  uint uVar27;
  int iVar28;
  undefined4 uVar29;
  long lVar30;
  RayHit *pRVar31;
  ulong uVar32;
  undefined4 uVar33;
  Scene *pSVar35;
  ulong uVar36;
  RayHit *pRVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  float fVar41;
  float fVar42;
  float fVar69;
  float fVar71;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar75;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  float fVar94;
  float fVar95;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar105;
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar107;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar108;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar128;
  float fVar129;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar137;
  float fVar141;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar142;
  uint uVar143;
  float fVar144;
  float fVar147;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12d4 [12];
  undefined8 local_12c8;
  undefined4 uStack_12c0;
  undefined4 uStack_12bc;
  float local_12b8 [2];
  uint uStack_12b0;
  uint uStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  RTCFilterFunctionNArguments local_1288;
  float local_1258;
  undefined4 local_1254;
  undefined4 local_1250;
  undefined4 local_124c;
  undefined4 local_1248;
  undefined4 local_1244;
  uint local_1240;
  uint local_123c;
  uint local_1238;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined1 local_1208 [12];
  float fStack_11fc;
  undefined1 local_11f8 [12];
  float fStack_11ec;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  uint local_11a8;
  float fStack_11a4;
  uint uStack_11a0;
  uint uStack_119c;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  ulong local_1090;
  ulong local_1088;
  undefined1 (*local_1080) [16];
  long local_1078;
  ulong local_1070;
  ulong local_1068;
  ulong local_1060;
  ulong local_1058;
  long local_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  RayHit *pRVar34;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1080 = (undefined1 (*) [16])local_f68;
      local_ff8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1008 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fb8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar74 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar107 = 0.0;
      if (0.0 <= fVar74) {
        fVar107 = fVar74;
      }
      aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar74 = (ray->super_RayK<1>).tfar;
      fVar83 = 0.0;
      if (0.0 <= fVar74) {
        fVar83 = fVar74;
      }
      auVar139._4_4_ = -(uint)(ABS(aVar6.y) < 1e-18);
      auVar139._0_4_ = -(uint)(ABS(aVar6.x) < 1e-18);
      auVar139._8_4_ = -(uint)(ABS(aVar6.z) < 1e-18);
      auVar139._12_4_ = -(uint)(ABS(aVar6.field_3.w) < 1e-18);
      auVar138 = divps(_DAT_01feca10,(undefined1  [16])aVar6);
      auVar139 = blendvps(auVar138,_DAT_0201c930,auVar139);
      local_1018 = auVar139._0_4_ * 0.99999964;
      local_1038 = auVar139._4_4_ * 0.99999964;
      local_fe8 = auVar139._8_4_ * 0.99999964;
      local_1048 = auVar139._0_4_ * 1.0000004;
      local_1028 = auVar139._4_4_ * 1.0000004;
      local_fd8 = auVar139._8_4_ * 1.0000004;
      local_1088 = (ulong)(local_1018 < 0.0) << 4;
      local_1090 = (ulong)(local_1038 < 0.0) << 4 | 0x20;
      local_1058 = (ulong)(local_fe8 < 0.0) << 4 | 0x40;
      local_1060 = local_1088 ^ 0x10;
      local_1068 = local_1090 ^ 0x10;
      local_1070 = local_1058 ^ 0x10;
      local_fc8._4_4_ = fVar107;
      local_fc8._0_4_ = fVar107;
      local_fc8._8_4_ = fVar107;
      local_fc8._12_4_ = fVar107;
      local_f98 = mm_lookupmask_ps._0_8_;
      uStack_f90 = mm_lookupmask_ps._8_8_;
      local_fa8 = mm_lookupmask_ps._240_8_;
      uStack_fa0 = mm_lookupmask_ps._248_8_;
      local_12d4._4_8_ = context;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      uVar32 = local_1088;
      pRVar34 = ray;
      uVar40 = local_1090;
      fVar74 = fVar83;
      fVar107 = fVar83;
      fVar97 = fVar83;
      auVar139 = local_fc8;
      fVar129 = local_fe8;
      fVar41 = local_fe8;
      fVar42 = local_fe8;
      fVar69 = local_fe8;
      fVar70 = local_1008;
      fVar71 = local_1008;
      fVar72 = local_1008;
      fVar73 = local_1008;
      fVar75 = local_1018;
      fVar81 = local_1018;
      fVar82 = local_1018;
      fVar84 = local_1018;
      fVar94 = local_1028;
      fVar95 = local_1028;
      fVar96 = local_1028;
      fVar98 = local_1028;
      fVar105 = local_1038;
      fVar106 = local_1038;
      fVar108 = local_1038;
      fVar114 = local_1038;
      fVar115 = local_1048;
      fVar116 = local_1048;
      fVar121 = local_1048;
      fVar125 = local_1048;
      fVar126 = local_fb8;
      fVar127 = local_fb8;
      fVar128 = local_fb8;
      fVar132 = local_fb8;
      fVar133 = local_fd8;
      fVar134 = local_fd8;
      fVar137 = local_fd8;
      fVar141 = local_fd8;
      fVar144 = local_ff8;
      fVar147 = local_ff8;
      fVar148 = local_ff8;
      fVar149 = local_ff8;
      do {
        do {
          do {
            if (local_1080 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar26 = local_1080 + -1;
            local_1080 = local_1080 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar26 + 8));
          uVar39 = *(ulong *)*local_1080;
          do {
            if ((uVar39 & 8) == 0) {
              pfVar1 = (float *)(uVar39 + 0x20 + uVar32);
              auVar76._0_4_ = (*pfVar1 - fVar144) * fVar75;
              auVar76._4_4_ = (pfVar1[1] - fVar147) * fVar81;
              auVar76._8_4_ = (pfVar1[2] - fVar148) * fVar82;
              auVar76._12_4_ = (pfVar1[3] - fVar149) * fVar84;
              pfVar1 = (float *)(uVar39 + 0x20 + uVar40);
              auVar111._0_4_ = (*pfVar1 - fVar70) * fVar105;
              auVar111._4_4_ = (pfVar1[1] - fVar71) * fVar106;
              auVar111._8_4_ = (pfVar1[2] - fVar72) * fVar108;
              auVar111._12_4_ = (pfVar1[3] - fVar73) * fVar114;
              auVar138 = maxps(auVar76,auVar111);
              pfVar1 = (float *)(uVar39 + 0x20 + local_1058);
              auVar118._0_4_ = (*pfVar1 - fVar126) * fVar129;
              auVar118._4_4_ = (pfVar1[1] - fVar127) * fVar41;
              auVar118._8_4_ = (pfVar1[2] - fVar128) * fVar42;
              auVar118._12_4_ = (pfVar1[3] - fVar132) * fVar69;
              auVar76 = maxps(auVar118,auVar139);
              _local_1208 = maxps(auVar138,auVar76);
              pfVar1 = (float *)(uVar39 + 0x20 + local_1060);
              auVar77._0_4_ = (*pfVar1 - fVar144) * fVar115;
              auVar77._4_4_ = (pfVar1[1] - fVar147) * fVar116;
              auVar77._8_4_ = (pfVar1[2] - fVar148) * fVar121;
              auVar77._12_4_ = (pfVar1[3] - fVar149) * fVar125;
              pfVar1 = (float *)(uVar39 + 0x20 + local_1068);
              auVar85._0_4_ = (*pfVar1 - fVar70) * fVar94;
              auVar85._4_4_ = (pfVar1[1] - fVar71) * fVar95;
              auVar85._8_4_ = (pfVar1[2] - fVar72) * fVar96;
              auVar85._12_4_ = (pfVar1[3] - fVar73) * fVar98;
              auVar76 = minps(auVar77,auVar85);
              pfVar1 = (float *)(uVar39 + 0x20 + local_1070);
              auVar86._0_4_ = (*pfVar1 - fVar126) * fVar133;
              auVar86._4_4_ = (pfVar1[1] - fVar127) * fVar134;
              auVar86._8_4_ = (pfVar1[2] - fVar128) * fVar137;
              auVar86._12_4_ = (pfVar1[3] - fVar132) * fVar141;
              auVar138._4_4_ = fVar74;
              auVar138._0_4_ = fVar83;
              auVar138._8_4_ = fVar107;
              auVar138._12_4_ = fVar97;
              auVar138 = minps(auVar86,auVar138);
              auVar138 = minps(auVar76,auVar138);
              auVar100._4_4_ = -(uint)(local_1208._4_4_ <= auVar138._4_4_);
              auVar100._0_4_ = -(uint)(local_1208._0_4_ <= auVar138._0_4_);
              auVar100._8_4_ = -(uint)(local_1208._8_4_ <= auVar138._8_4_);
              auVar100._12_4_ = -(uint)(local_1208._12_4_ <= auVar138._12_4_);
              uVar33 = movmskps((int)pRVar34,auVar100);
              pRVar34 = (RayHit *)CONCAT44((int)((ulong)pRVar34 >> 0x20),uVar33);
            }
            if ((uVar39 & 8) == 0) {
              if (pRVar34 == (RayHit *)0x0) {
                iVar28 = 4;
              }
              else {
                uVar38 = uVar39 & 0xfffffffffffffff0;
                lVar13 = 0;
                if (pRVar34 != (RayHit *)0x0) {
                  for (; ((ulong)pRVar34 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                iVar28 = 0;
                uVar39 = *(ulong *)(uVar38 + lVar13 * 8);
                uVar36 = (ulong)&pRVar34[-1].field_0x5f & (ulong)pRVar34;
                if (uVar36 != 0) {
                  uVar27 = *(uint *)(local_1208 + lVar13 * 4);
                  lVar13 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                    }
                  }
                  uVar8 = *(ulong *)(uVar38 + lVar13 * 8);
                  uVar142 = *(uint *)(local_1208 + lVar13 * 4);
                  uVar36 = uVar36 - 1 & uVar36;
                  if (uVar36 == 0) {
                    if (uVar27 < uVar142) {
                      *(ulong *)*local_1080 = uVar8;
                      *(uint *)((long)*local_1080 + 8) = uVar142;
                      local_1080 = local_1080 + 1;
                    }
                    else {
                      *(ulong *)*local_1080 = uVar39;
                      *(uint *)((long)*local_1080 + 8) = uVar27;
                      local_1080 = local_1080 + 1;
                      uVar39 = uVar8;
                    }
                  }
                  else {
                    auVar78._8_4_ = uVar27;
                    auVar78._0_8_ = uVar39;
                    auVar78._12_4_ = 0;
                    auVar109._8_4_ = uVar142;
                    auVar109._0_8_ = uVar8;
                    auVar109._12_4_ = 0;
                    lVar13 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                      }
                    }
                    uVar9 = *(undefined8 *)(uVar38 + lVar13 * 8);
                    iVar7 = *(int *)(local_1208 + lVar13 * 4);
                    auVar87._8_4_ = iVar7;
                    auVar87._0_8_ = uVar9;
                    auVar87._12_4_ = 0;
                    auVar43._8_4_ = -(uint)((int)uVar27 < (int)uVar142);
                    uVar36 = uVar36 - 1 & uVar36;
                    if (uVar36 == 0) {
                      auVar43._4_4_ = auVar43._8_4_;
                      auVar43._0_4_ = auVar43._8_4_;
                      auVar43._12_4_ = auVar43._8_4_;
                      auVar99._8_4_ = uVar142;
                      auVar99._0_8_ = uVar8;
                      auVar99._12_4_ = 0;
                      auVar76 = blendvps(auVar99,auVar78,auVar43);
                      auVar138 = blendvps(auVar78,auVar109,auVar43);
                      auVar44._8_4_ = -(uint)(auVar76._8_4_ < iVar7);
                      auVar44._4_4_ = auVar44._8_4_;
                      auVar44._0_4_ = auVar44._8_4_;
                      auVar44._12_4_ = auVar44._8_4_;
                      auVar110._8_4_ = iVar7;
                      auVar110._0_8_ = uVar9;
                      auVar110._12_4_ = 0;
                      auVar111 = blendvps(auVar110,auVar76,auVar44);
                      auVar100 = blendvps(auVar76,auVar87,auVar44);
                      auVar45._8_4_ = -(uint)(auVar138._8_4_ < auVar100._8_4_);
                      auVar45._4_4_ = auVar45._8_4_;
                      auVar45._0_4_ = auVar45._8_4_;
                      auVar45._12_4_ = auVar45._8_4_;
                      auVar76 = blendvps(auVar100,auVar138,auVar45);
                      auVar138 = blendvps(auVar138,auVar100,auVar45);
                      *local_1080 = auVar138;
                      local_1080[1] = auVar76;
                      uVar39 = auVar111._0_8_;
                      local_1080 = local_1080 + 2;
                    }
                    else {
                      lVar13 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                        }
                      }
                      auVar46._4_4_ = auVar43._8_4_;
                      auVar46._0_4_ = auVar43._8_4_;
                      auVar46._8_4_ = auVar43._8_4_;
                      auVar46._12_4_ = auVar43._8_4_;
                      auVar100 = blendvps(auVar109,auVar78,auVar46);
                      auVar138 = blendvps(auVar78,auVar109,auVar46);
                      auVar117._8_4_ = *(int *)(local_1208 + lVar13 * 4);
                      auVar117._0_8_ = *(undefined8 *)(uVar38 + lVar13 * 8);
                      auVar117._12_4_ = 0;
                      auVar47._8_4_ = -(uint)(iVar7 < *(int *)(local_1208 + lVar13 * 4));
                      auVar47._4_4_ = auVar47._8_4_;
                      auVar47._0_4_ = auVar47._8_4_;
                      auVar47._12_4_ = auVar47._8_4_;
                      auVar111 = blendvps(auVar117,auVar87,auVar47);
                      auVar76 = blendvps(auVar87,auVar117,auVar47);
                      auVar48._8_4_ = -(uint)(auVar138._8_4_ < auVar76._8_4_);
                      auVar48._4_4_ = auVar48._8_4_;
                      auVar48._0_4_ = auVar48._8_4_;
                      auVar48._12_4_ = auVar48._8_4_;
                      auVar118 = blendvps(auVar76,auVar138,auVar48);
                      auVar138 = blendvps(auVar138,auVar76,auVar48);
                      auVar49._8_4_ = -(uint)(auVar100._8_4_ < auVar111._8_4_);
                      auVar49._4_4_ = auVar49._8_4_;
                      auVar49._0_4_ = auVar49._8_4_;
                      auVar49._12_4_ = auVar49._8_4_;
                      auVar76 = blendvps(auVar111,auVar100,auVar49);
                      auVar100 = blendvps(auVar100,auVar111,auVar49);
                      auVar50._8_4_ = -(uint)(auVar100._8_4_ < auVar118._8_4_);
                      auVar50._4_4_ = auVar50._8_4_;
                      auVar50._0_4_ = auVar50._8_4_;
                      auVar50._12_4_ = auVar50._8_4_;
                      auVar111 = blendvps(auVar118,auVar100,auVar50);
                      auVar100 = blendvps(auVar100,auVar118,auVar50);
                      *local_1080 = auVar138;
                      local_1080[1] = auVar100;
                      local_1080[2] = auVar111;
                      uVar39 = auVar76._0_8_;
                      local_1080 = local_1080 + 3;
                      fVar105 = local_1038;
                      fVar106 = fStack_1034;
                      fVar108 = fStack_1030;
                      fVar114 = fStack_102c;
                      fVar115 = local_1048;
                      fVar116 = fStack_1044;
                      fVar121 = fStack_1040;
                      fVar125 = fStack_103c;
                    }
                  }
                }
              }
            }
            else {
              iVar28 = 6;
            }
          } while (iVar28 == 0);
        } while (iVar28 != 6);
        local_1078 = (ulong)((uint)uVar39 & 0xf) - 8;
        if (local_1078 != 0) {
          uVar39 = uVar39 & 0xfffffffffffffff0;
          local_1050 = 0;
          do {
            lVar30 = local_1050 * 0xe0;
            puVar5 = (undefined8 *)(uVar39 + 0xd0 + lVar30);
            local_1218 = *puVar5;
            uStack_1210 = puVar5[1];
            fVar74 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar107 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar83 = (ray->super_RayK<1>).org.field_0.m128[2];
            pfVar4 = (float *)(uVar39 + lVar30);
            pfVar1 = (float *)(uVar39 + 0x10 + lVar30);
            pfVar2 = (float *)(uVar39 + 0x20 + lVar30);
            pfVar3 = (float *)(uVar39 + 0x30 + lVar30);
            local_1298 = *pfVar4 - fVar74;
            fStack_1294 = pfVar4[1] - fVar74;
            fStack_1290 = pfVar4[2] - fVar74;
            fStack_128c = pfVar4[3] - fVar74;
            local_10a8 = *pfVar1 - fVar107;
            fStack_10a4 = pfVar1[1] - fVar107;
            fStack_10a0 = pfVar1[2] - fVar107;
            fStack_109c = pfVar1[3] - fVar107;
            local_10b8 = *pfVar2 - fVar83;
            fStack_10b4 = pfVar2[1] - fVar83;
            fStack_10b0 = pfVar2[2] - fVar83;
            fStack_10ac = pfVar2[3] - fVar83;
            fVar41 = *pfVar3 - fVar74;
            fVar69 = pfVar3[1] - fVar74;
            fVar71 = pfVar3[2] - fVar74;
            fVar73 = pfVar3[3] - fVar74;
            pfVar1 = (float *)(uVar39 + 0x40 + lVar30);
            fVar84 = *pfVar1 - fVar107;
            fVar94 = pfVar1[1] - fVar107;
            fVar95 = pfVar1[2] - fVar107;
            fVar96 = pfVar1[3] - fVar107;
            pfVar1 = (float *)(uVar39 + 0x50 + lVar30);
            fVar121 = *pfVar1 - fVar83;
            fVar125 = pfVar1[1] - fVar83;
            fVar126 = pfVar1[2] - fVar83;
            fVar127 = pfVar1[3] - fVar83;
            pfVar1 = (float *)(uVar39 + 0x90 + lVar30);
            fVar42 = *pfVar1 - fVar74;
            fVar70 = pfVar1[1] - fVar74;
            fVar72 = pfVar1[2] - fVar74;
            fVar74 = pfVar1[3] - fVar74;
            pfVar1 = (float *)(uVar39 + 0xa0 + lVar30);
            fVar98 = *pfVar1 - fVar107;
            fVar105 = pfVar1[1] - fVar107;
            fVar106 = pfVar1[2] - fVar107;
            fVar107 = pfVar1[3] - fVar107;
            pfVar1 = (float *)(uVar39 + 0xb0 + lVar30);
            fVar75 = *pfVar1 - fVar83;
            fVar81 = pfVar1[1] - fVar83;
            fVar82 = pfVar1[2] - fVar83;
            fVar83 = pfVar1[3] - fVar83;
            fVar128 = fVar42 - local_1298;
            fVar132 = fVar70 - fStack_1294;
            fVar133 = fVar72 - fStack_1290;
            fVar134 = fVar74 - fStack_128c;
            local_10d8 = fVar98 - local_10a8;
            fStack_10d4 = fVar105 - fStack_10a4;
            fStack_10d0 = fVar106 - fStack_10a0;
            fStack_10cc = fVar107 - fStack_109c;
            local_10c8 = fVar75 - local_10b8;
            fStack_10c4 = fVar81 - fStack_10b4;
            fStack_10c0 = fVar82 - fStack_10b0;
            fStack_10bc = fVar83 - fStack_10ac;
            fVar97 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar129 = (ray->super_RayK<1>).dir.field_0.m128[1];
            uStack_12c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar144 = (local_10d8 * (local_10b8 + fVar75) - (local_10a8 + fVar98) * local_10c8) *
                      fVar97 + ((local_1298 + fVar42) * local_10c8 - (local_10b8 + fVar75) * fVar128
                               ) * fVar129 +
                               (fVar128 * (local_10a8 + fVar98) - (local_1298 + fVar42) * local_10d8
                               ) * (float)uStack_12c0;
            fVar147 = (fStack_10d4 * (fStack_10b4 + fVar81) - (fStack_10a4 + fVar105) * fStack_10c4)
                      * fVar97 +
                      ((fStack_1294 + fVar70) * fStack_10c4 - (fStack_10b4 + fVar81) * fVar132) *
                      fVar129 + (fVar132 * (fStack_10a4 + fVar105) -
                                (fStack_1294 + fVar70) * fStack_10d4) * (float)uStack_12c0;
            local_1208._0_8_ = CONCAT44(fVar147,fVar144);
            local_1208._8_4_ =
                 (fStack_10d0 * (fStack_10b0 + fVar82) - (fStack_10a0 + fVar106) * fStack_10c0) *
                 fVar97 + ((fStack_1290 + fVar72) * fStack_10c0 - (fStack_10b0 + fVar82) * fVar133)
                          * fVar129 +
                          (fVar133 * (fStack_10a0 + fVar106) - (fStack_1290 + fVar72) * fStack_10d0)
                          * (float)uStack_12c0;
            fStack_11fc = (fStack_10cc * (fStack_10ac + fVar83) -
                          (fStack_109c + fVar107) * fStack_10bc) * fVar97 +
                          ((fStack_128c + fVar74) * fStack_10bc - (fStack_10ac + fVar83) * fVar134)
                          * fVar129 +
                          (fVar134 * (fStack_109c + fVar107) - (fStack_128c + fVar74) * fStack_10cc)
                          * (float)uStack_12c0;
            local_10e8 = local_1298 - fVar41;
            fStack_10e4 = fStack_1294 - fVar69;
            fStack_10e0 = fStack_1290 - fVar71;
            fStack_10dc = fStack_128c - fVar73;
            fVar108 = local_10a8 - fVar84;
            fVar114 = fStack_10a4 - fVar94;
            fVar115 = fStack_10a0 - fVar95;
            fVar116 = fStack_109c - fVar96;
            local_10f8._0_4_ = local_10b8 - fVar121;
            local_10f8._4_4_ = fStack_10b4 - fVar125;
            fStack_10f0 = fStack_10b0 - fVar126;
            fStack_10ec = fStack_10ac - fVar127;
            fVar137 = (fVar108 * (local_10b8 + fVar121) -
                      (local_10a8 + fVar84) * (float)local_10f8._0_4_) * fVar97 +
                      ((local_1298 + fVar41) * (float)local_10f8._0_4_ -
                      (local_10b8 + fVar121) * local_10e8) * fVar129 +
                      (local_10e8 * (local_10a8 + fVar84) - (local_1298 + fVar41) * fVar108) *
                      (float)uStack_12c0;
            fVar141 = (fVar114 * (fStack_10b4 + fVar125) -
                      (fStack_10a4 + fVar94) * (float)local_10f8._4_4_) * fVar97 +
                      ((fStack_1294 + fVar69) * (float)local_10f8._4_4_ -
                      (fStack_10b4 + fVar125) * fStack_10e4) * fVar129 +
                      (fStack_10e4 * (fStack_10a4 + fVar94) - (fStack_1294 + fVar69) * fVar114) *
                      (float)uStack_12c0;
            local_1108._0_8_ = CONCAT44(fVar141,fVar137);
            local_1108._8_4_ =
                 (fVar115 * (fStack_10b0 + fVar126) - (fStack_10a0 + fVar95) * fStack_10f0) * fVar97
                 + ((fStack_1290 + fVar71) * fStack_10f0 - (fStack_10b0 + fVar126) * fStack_10e0) *
                   fVar129 + (fStack_10e0 * (fStack_10a0 + fVar95) -
                             (fStack_1290 + fVar71) * fVar115) * (float)uStack_12c0;
            local_1108._12_4_ =
                 (fVar116 * (fStack_10ac + fVar127) - (fStack_109c + fVar96) * fStack_10ec) * fVar97
                 + ((fStack_128c + fVar73) * fStack_10ec - (fStack_10ac + fVar127) * fStack_10dc) *
                   fVar129 + (fStack_10dc * (fStack_109c + fVar96) -
                             (fStack_128c + fVar73) * fVar116) * (float)uStack_12c0;
            local_1128 = fVar41 - fVar42;
            fStack_1124 = fVar69 - fVar70;
            fStack_1120 = fVar71 - fVar72;
            fStack_111c = fVar73 - fVar74;
            local_1118 = fVar84 - fVar98;
            fStack_1114 = fVar94 - fVar105;
            fStack_1110 = fVar95 - fVar106;
            fStack_110c = fVar96 - fVar107;
            fVar148 = fVar121 - fVar75;
            fVar149 = fVar125 - fVar81;
            fVar150 = fVar126 - fVar82;
            fVar151 = fVar127 - fVar83;
            local_12c8 = (RayHit *)CONCAT44(uStack_12c0,uStack_12c0);
            uStack_12bc = uStack_12c0;
            auVar88._0_4_ =
                 (local_1118 * (fVar75 + fVar121) - (fVar98 + fVar84) * fVar148) * fVar97 +
                 ((fVar42 + fVar41) * fVar148 - (fVar75 + fVar121) * local_1128) * fVar129 +
                 (local_1128 * (fVar98 + fVar84) - (fVar42 + fVar41) * local_1118) *
                 (float)uStack_12c0;
            auVar88._4_4_ =
                 (fStack_1114 * (fVar81 + fVar125) - (fVar105 + fVar94) * fVar149) * fVar97 +
                 ((fVar70 + fVar69) * fVar149 - (fVar81 + fVar125) * fStack_1124) * fVar129 +
                 (fStack_1124 * (fVar105 + fVar94) - (fVar70 + fVar69) * fStack_1114) *
                 (float)uStack_12c0;
            auVar88._8_4_ =
                 (fStack_1110 * (fVar82 + fVar126) - (fVar106 + fVar95) * fVar150) * fVar97 +
                 ((fVar72 + fVar71) * fVar150 - (fVar82 + fVar126) * fStack_1120) * fVar129 +
                 (fStack_1120 * (fVar106 + fVar95) - (fVar72 + fVar71) * fStack_1110) *
                 (float)uStack_12c0;
            auVar88._12_4_ =
                 (fStack_110c * (fVar83 + fVar127) - (fVar107 + fVar96) * fVar151) * fVar97 +
                 ((fVar74 + fVar73) * fVar151 - (fVar83 + fVar127) * fStack_111c) * fVar129 +
                 (fStack_111c * (fVar107 + fVar96) - (fVar74 + fVar73) * fStack_110c) *
                 (float)uStack_12c0;
            local_1228 = fVar137 + fVar144 + auVar88._0_4_;
            fStack_1224 = fVar141 + fVar147 + auVar88._4_4_;
            fStack_1220 = local_1108._8_4_ + (float)local_1208._8_4_ + auVar88._8_4_;
            fStack_121c = local_1108._12_4_ + fStack_11fc + auVar88._12_4_;
            auVar51._8_4_ = local_1208._8_4_;
            auVar51._0_8_ = local_1208._0_8_;
            auVar51._12_4_ = fStack_11fc;
            auVar139 = minps(auVar51,local_1108);
            auVar139 = minps(auVar139,auVar88);
            fStack_12a0 = (float)local_1208._8_4_;
            local_12a8 = (undefined1  [8])local_1208._0_8_;
            fStack_129c = fStack_11fc;
            auVar101._8_4_ = local_1208._8_4_;
            auVar101._0_8_ = local_1208._0_8_;
            auVar101._12_4_ = fStack_11fc;
            auVar138 = maxps(auVar101,local_1108);
            auVar138 = maxps(auVar138,auVar88);
            fVar74 = ABS(local_1228) * 1.1920929e-07;
            fVar107 = ABS(fStack_1224) * 1.1920929e-07;
            fVar83 = ABS(fStack_1220) * 1.1920929e-07;
            fVar41 = ABS(fStack_121c) * 1.1920929e-07;
            auVar102._4_4_ = -(uint)(auVar138._4_4_ <= fVar107);
            auVar102._0_4_ = -(uint)(auVar138._0_4_ <= fVar74);
            auVar102._8_4_ = -(uint)(auVar138._8_4_ <= fVar83);
            auVar102._12_4_ = -(uint)(auVar138._12_4_ <= fVar41);
            auVar52._4_4_ = -(uint)(-fVar107 <= auVar139._4_4_);
            auVar52._0_4_ = -(uint)(-fVar74 <= auVar139._0_4_);
            auVar52._8_4_ = -(uint)(-fVar83 <= auVar139._8_4_);
            auVar52._12_4_ = -(uint)(-fVar41 <= auVar139._12_4_);
            auVar102 = auVar102 | auVar52;
            lVar13 = lVar30 + uVar39;
            uVar33 = (undefined4)((ulong)lVar30 >> 0x20);
            uVar27 = movmskps((int)lVar30,auVar102);
            if (uVar27 != 0) {
              local_f88 = fVar148;
              fStack_f84 = fVar149;
              fStack_f80 = fVar150;
              fStack_f7c = fVar151;
              auVar112._0_4_ = local_10d8 * (float)local_10f8._0_4_ - fVar108 * local_10c8;
              auVar112._4_4_ = fStack_10d4 * (float)local_10f8._4_4_ - fVar114 * fStack_10c4;
              auVar112._8_4_ = fStack_10d0 * fStack_10f0 - fVar115 * fStack_10c0;
              auVar112._12_4_ = fStack_10cc * fStack_10ec - fVar116 * fStack_10bc;
              auVar119._0_4_ = fVar108 * fVar148 - (float)local_10f8._0_4_ * local_1118;
              auVar119._4_4_ = fVar114 * fVar149 - (float)local_10f8._4_4_ * fStack_1114;
              auVar119._8_4_ = fVar115 * fVar150 - fStack_10f0 * fStack_1110;
              auVar119._12_4_ = fVar116 * fVar151 - fStack_10ec * fStack_110c;
              auVar53._4_4_ =
                   -(uint)(ABS(fVar114 * fStack_10c4) < ABS((float)local_10f8._4_4_ * fStack_1114));
              auVar53._0_4_ =
                   -(uint)(ABS(fVar108 * local_10c8) < ABS((float)local_10f8._0_4_ * local_1118));
              auVar53._8_4_ = -(uint)(ABS(fVar115 * fStack_10c0) < ABS(fStack_10f0 * fStack_1110));
              auVar53._12_4_ = -(uint)(ABS(fVar116 * fStack_10bc) < ABS(fStack_10ec * fStack_110c));
              local_11d8 = blendvps(auVar119,auVar112,auVar53);
              auVar89._0_4_ = (float)local_10f8._0_4_ * local_1128 - local_10e8 * fVar148;
              auVar89._4_4_ = (float)local_10f8._4_4_ * fStack_1124 - fStack_10e4 * fVar149;
              auVar89._8_4_ = fStack_10f0 * fStack_1120 - fStack_10e0 * fVar150;
              auVar89._12_4_ = fStack_10ec * fStack_111c - fStack_10dc * fVar151;
              auVar54._4_4_ =
                   -(uint)(ABS((float)local_10f8._4_4_ * fVar132) < ABS(fStack_10e4 * fVar149));
              auVar54._0_4_ =
                   -(uint)(ABS((float)local_10f8._0_4_ * fVar128) < ABS(local_10e8 * fVar148));
              auVar54._8_4_ = -(uint)(ABS(fStack_10f0 * fVar133) < ABS(fStack_10e0 * fVar150));
              auVar54._12_4_ = -(uint)(ABS(fStack_10ec * fVar134) < ABS(fStack_10dc * fVar151));
              auVar20._4_4_ = fStack_10c4 * fStack_10e4 - (float)local_10f8._4_4_ * fVar132;
              auVar20._0_4_ = local_10c8 * local_10e8 - (float)local_10f8._0_4_ * fVar128;
              auVar20._8_4_ = fStack_10c0 * fStack_10e0 - fStack_10f0 * fVar133;
              auVar20._12_4_ = fStack_10bc * fStack_10dc - fStack_10ec * fVar134;
              local_11c8 = blendvps(auVar89,auVar20,auVar54);
              auVar145._0_4_ = local_10e8 * local_1118 - fVar108 * local_1128;
              auVar145._4_4_ = fStack_10e4 * fStack_1114 - fVar114 * fStack_1124;
              auVar145._8_4_ = fStack_10e0 * fStack_1110 - fVar115 * fStack_1120;
              auVar145._12_4_ = fStack_10dc * fStack_110c - fVar116 * fStack_111c;
              auVar55._4_4_ = -(uint)(ABS(fStack_10e4 * fStack_10d4) < ABS(fVar114 * fStack_1124));
              auVar55._0_4_ = -(uint)(ABS(local_10e8 * local_10d8) < ABS(fVar108 * local_1128));
              auVar55._8_4_ = -(uint)(ABS(fStack_10e0 * fStack_10d0) < ABS(fVar115 * fStack_1120));
              auVar55._12_4_ = -(uint)(ABS(fStack_10dc * fStack_10cc) < ABS(fVar116 * fStack_111c));
              auVar22._4_4_ = fVar132 * fVar114 - fStack_10e4 * fStack_10d4;
              auVar22._0_4_ = fVar128 * fVar108 - local_10e8 * local_10d8;
              auVar22._8_4_ = fVar133 * fVar115 - fStack_10e0 * fStack_10d0;
              auVar22._12_4_ = fVar134 * fVar116 - fStack_10dc * fStack_10cc;
              local_11b8 = blendvps(auVar145,auVar22,auVar55);
              fVar70 = fVar97 * local_11d8._0_4_ +
                       fVar129 * local_11c8._0_4_ + (float)uStack_12c0 * local_11b8._0_4_;
              fVar71 = fVar97 * local_11d8._4_4_ +
                       fVar129 * local_11c8._4_4_ + (float)uStack_12c0 * local_11b8._4_4_;
              fVar72 = fVar97 * local_11d8._8_4_ +
                       fVar129 * local_11c8._8_4_ + (float)uStack_12c0 * local_11b8._8_4_;
              fVar73 = fVar97 * local_11d8._12_4_ +
                       fVar129 * local_11c8._12_4_ + (float)uStack_12c0 * local_11b8._12_4_;
              fVar70 = fVar70 + fVar70;
              fVar71 = fVar71 + fVar71;
              fVar72 = fVar72 + fVar72;
              fVar73 = fVar73 + fVar73;
              auVar56._0_4_ = local_10a8 * local_11c8._0_4_ + local_10b8 * local_11b8._0_4_;
              auVar56._4_4_ = fStack_10a4 * local_11c8._4_4_ + fStack_10b4 * local_11b8._4_4_;
              auVar56._8_4_ = fStack_10a0 * local_11c8._8_4_ + fStack_10b0 * local_11b8._8_4_;
              auVar56._12_4_ = fStack_109c * local_11c8._12_4_ + fStack_10ac * local_11b8._12_4_;
              fVar129 = local_1298 * local_11d8._0_4_ + auVar56._0_4_;
              fVar41 = fStack_1294 * local_11d8._4_4_ + auVar56._4_4_;
              fVar42 = fStack_1290 * local_11d8._8_4_ + auVar56._8_4_;
              fVar69 = fStack_128c * local_11d8._12_4_ + auVar56._12_4_;
              auVar14._4_4_ = fVar71;
              auVar14._0_4_ = fVar70;
              auVar14._8_4_ = fVar72;
              auVar14._12_4_ = fVar73;
              auVar139 = rcpps(auVar56,auVar14);
              fVar74 = auVar139._0_4_;
              fVar107 = auVar139._4_4_;
              fVar83 = auVar139._8_4_;
              fVar97 = auVar139._12_4_;
              auVar135._0_4_ = ((1.0 - fVar70 * fVar74) * fVar74 + fVar74) * (fVar129 + fVar129);
              auVar135._4_4_ = ((1.0 - fVar71 * fVar107) * fVar107 + fVar107) * (fVar41 + fVar41);
              auVar135._8_4_ = ((1.0 - fVar72 * fVar83) * fVar83 + fVar83) * (fVar42 + fVar42);
              auVar135._12_4_ = ((1.0 - fVar73 * fVar97) * fVar97 + fVar97) * (fVar69 + fVar69);
              local_11e8._4_4_ = fStack_1224;
              local_11e8._0_4_ = local_1228;
              local_11e8._8_4_ = fStack_1220;
              local_11e8._12_4_ = fStack_121c;
              fVar74 = (ray->super_RayK<1>).tfar;
              fVar107 = (ray->super_RayK<1>).org.field_0.m128[3];
              local_11a8 = -(uint)(fVar70 != 0.0) & auVar102._0_4_ &
                           -(uint)(auVar135._0_4_ <= fVar74 && fVar107 <= auVar135._0_4_);
              fStack_11a4 = (float)(-(uint)(fVar71 != 0.0) & auVar102._4_4_ &
                                   -(uint)(auVar135._4_4_ <= fVar74 && fVar107 <= auVar135._4_4_));
              uStack_11a0 = -(uint)(fVar72 != 0.0) & auVar102._8_4_ &
                            -(uint)(auVar135._8_4_ <= fVar74 && fVar107 <= auVar135._8_4_);
              uStack_119c = -(uint)(fVar73 != 0.0) & auVar102._12_4_ &
                            -(uint)(auVar135._12_4_ <= fVar74 && fVar107 <= auVar135._12_4_);
              auVar15._4_4_ = fStack_11a4;
              auVar15._0_4_ = local_11a8;
              auVar15._8_4_ = uStack_11a0;
              auVar15._12_4_ = uStack_119c;
              uVar27 = movmskps(uVar27,auVar15);
              if (uVar27 != 0) {
                local_11f8._8_4_ = local_1108._8_4_;
                local_11f8._0_8_ = local_1108._0_8_;
                fStack_11ec = local_1108._12_4_;
                local_1178 = auVar135;
                local_1138._8_8_ = uStack_f90;
                local_1138._0_8_ = local_f98;
                pSVar35 = context->scene;
                local_12b8[0] = (float)local_11a8;
                local_12b8[1] = fStack_11a4;
                uStack_12b0 = uStack_11a0;
                uStack_12ac = uStack_119c;
                auVar139 = rcpps(auVar102,local_11e8);
                fVar129 = auVar139._0_4_;
                fVar41 = auVar139._4_4_;
                fVar42 = auVar139._8_4_;
                fVar69 = auVar139._12_4_;
                fVar107 = (float)DAT_01feca10;
                fVar83 = DAT_01feca10._4_4_;
                fVar97 = DAT_01feca10._12_4_;
                fVar74 = DAT_01feca10._8_4_;
                fVar129 = (float)(-(uint)(1e-18 <= ABS(local_1228)) &
                                 (uint)((fVar107 - local_1228 * fVar129) * fVar129 + fVar129));
                fVar41 = (float)(-(uint)(1e-18 <= ABS(fStack_1224)) &
                                (uint)((fVar83 - fStack_1224 * fVar41) * fVar41 + fVar41));
                fVar42 = (float)(-(uint)(1e-18 <= ABS(fStack_1220)) &
                                (uint)((fVar74 - fStack_1220 * fVar42) * fVar42 + fVar42));
                fVar69 = (float)(-(uint)(1e-18 <= ABS(fStack_121c)) &
                                (uint)((fVar97 - fStack_121c * fVar69) * fVar69 + fVar69));
                auVar130._0_4_ = fVar144 * fVar129;
                auVar130._4_4_ = fVar147 * fVar41;
                auVar130._8_4_ = (float)local_1208._8_4_ * fVar42;
                auVar130._12_4_ = fStack_11fc * fVar69;
                auVar138 = minps(auVar130,_DAT_01feca10);
                auVar122._0_4_ = fVar129 * fVar137;
                auVar122._4_4_ = fVar41 * fVar141;
                auVar122._8_4_ = fVar42 * local_1108._8_4_;
                auVar122._12_4_ = fVar69 * local_1108._12_4_;
                auVar139 = minps(auVar122,_DAT_01feca10);
                auVar79._0_4_ = fVar107 - auVar138._0_4_;
                auVar79._4_4_ = fVar83 - auVar138._4_4_;
                auVar79._8_4_ = fVar74 - auVar138._8_4_;
                auVar79._12_4_ = fVar97 - auVar138._12_4_;
                auVar90._0_4_ = fVar107 - auVar139._0_4_;
                auVar90._4_4_ = fVar83 - auVar139._4_4_;
                auVar90._8_4_ = fVar74 - auVar139._8_4_;
                auVar90._12_4_ = fVar97 - auVar139._12_4_;
                local_1198 = blendvps(auVar138,auVar79,local_1138);
                local_1188 = blendvps(auVar139,auVar90,local_1138);
                local_1168 = local_11d8;
                local_1158 = local_11c8;
                local_1148 = local_11b8;
                auVar57._4_4_ = fStack_11a4;
                auVar57._0_4_ = local_11a8;
                auVar57._8_4_ = uStack_11a0;
                auVar57._12_4_ = uStack_119c;
                auVar138 = blendvps(_DAT_01feb9f0,auVar135,auVar57);
                auVar91._4_4_ = auVar138._0_4_;
                auVar91._0_4_ = auVar138._4_4_;
                auVar91._8_4_ = auVar138._12_4_;
                auVar91._12_4_ = auVar138._8_4_;
                auVar139 = minps(auVar91,auVar138);
                auVar58._0_8_ = auVar139._8_8_;
                auVar58._8_4_ = auVar139._0_4_;
                auVar58._12_4_ = auVar139._4_4_;
                auVar139 = minps(auVar58,auVar139);
                auVar59._0_4_ = -(uint)(auVar139._0_4_ == auVar138._0_4_) & local_11a8;
                auVar59._4_4_ =
                     (float)(-(uint)(auVar139._4_4_ == auVar138._4_4_) & (uint)fStack_11a4);
                auVar59._8_4_ = -(uint)(auVar139._8_4_ == auVar138._8_4_) & uStack_11a0;
                auVar59._12_4_ = -(uint)(auVar139._12_4_ == auVar138._12_4_) & uStack_119c;
                iVar28 = movmskps(uVar27,auVar59);
                uVar27 = local_11a8;
                fVar74 = fStack_11a4;
                uVar142 = uStack_11a0;
                uVar143 = uStack_119c;
                if (iVar28 != 0) {
                  uVar27 = auVar59._0_4_;
                  fVar74 = auVar59._4_4_;
                  uVar142 = auVar59._8_4_;
                  uVar143 = auVar59._12_4_;
                }
                auVar16._4_4_ = fVar74;
                auVar16._0_4_ = uVar27;
                auVar16._8_4_ = uVar142;
                auVar16._12_4_ = uVar143;
                uVar29 = movmskps(iVar28,auVar16);
                pRVar37 = (RayHit *)0x0;
                if (CONCAT44(uVar33,uVar29) != 0) {
                  for (; (CONCAT44(uVar33,uVar29) >> (long)pRVar37 & 1) == 0;
                      pRVar37 = (RayHit *)((long)(pRVar37->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar27 = *(uint *)(lVar13 + 0xc0 + (long)pRVar37 * 4);
                  pRVar31 = (RayHit *)(ulong)uVar27;
                  pGVar10 = (pSVar35->geometries).items[(long)pRVar31].ptr;
                  if ((pGVar10->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_12b8[(long)pRVar37] = 0.0;
                  }
                  else {
                    pRVar11 = context->args;
                    if ((pRVar11->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar74 = *(float *)(local_1198 + (long)pRVar37 * 4);
                      fVar107 = *(float *)(local_1188 + (long)pRVar37 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1178 + (long)pRVar37 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1168 + (long)pRVar37 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1158 + (long)pRVar37 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_1148 + (long)pRVar37 * 4);
                      ray->u = fVar74;
                      ray->v = fVar107;
                      ray->primID = *(uint *)((long)&local_1218 + (long)pRVar37 * 4);
                      ray->geomID = uVar27;
                      pRVar12 = context->user;
                      ray->instID[0] = pRVar12->instID[0];
                      uVar27 = pRVar12->instPrimID[0];
                      uVar33 = 0;
                      ray->instPrimID[0] = uVar27;
                      break;
                    }
                    local_1288.context = context->user;
                    local_1258 = *(float *)(local_1168 + (long)pRVar37 * 4);
                    local_1254 = *(undefined4 *)(local_1158 + (long)pRVar37 * 4);
                    local_1250 = *(undefined4 *)(local_1148 + (long)pRVar37 * 4);
                    local_124c = *(undefined4 *)(local_1198 + (long)pRVar37 * 4);
                    local_1248 = *(undefined4 *)(local_1188 + (long)pRVar37 * 4);
                    local_1244 = *(undefined4 *)((long)&local_1218 + (long)pRVar37 * 4);
                    local_1240 = uVar27;
                    local_123c = (local_1288.context)->instID[0];
                    local_1238 = (local_1288.context)->instPrimID[0];
                    local_12a8._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1178 + (long)pRVar37 * 4);
                    local_12d4._0_4_ = -NAN;
                    local_1288.valid = (int *)local_12d4;
                    local_1288.geometryUserPtr = pGVar10->userPtr;
                    local_1288.ray = (RTCRayN *)ray;
                    local_1288.hit = (RTCHitN *)&local_1258;
                    local_1288.N = 1;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e7f34d:
                      if (pRVar11->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar11->filter)(&local_1288);
                          context = (RayQueryContext *)local_12d4._4_8_;
                        }
                        if ((((RayK<1> *)local_1288.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00e7f433;
                      }
                      (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1288.hit;
                      (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1288.hit + 4);
                      (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1288.hit + 8);
                      *(float *)((long)local_1288.ray + 0x3c) = *(float *)(local_1288.hit + 0xc);
                      *(float *)((long)local_1288.ray + 0x40) = *(float *)(local_1288.hit + 0x10);
                      *(float *)((long)local_1288.ray + 0x44) = *(float *)(local_1288.hit + 0x14);
                      *(float *)((long)local_1288.ray + 0x48) = *(float *)(local_1288.hit + 0x18);
                      *(float *)((long)local_1288.ray + 0x4c) = *(float *)(local_1288.hit + 0x1c);
                      *(float *)((long)local_1288.ray + 0x50) = *(float *)(local_1288.hit + 0x20);
                      pRVar31 = (RayHit *)local_1288.ray;
                    }
                    else {
                      local_1298 = SUB84(pSVar35,0);
                      fStack_1294 = (float)((ulong)pSVar35 >> 0x20);
                      local_12c8 = pRVar34;
                      (*pGVar10->intersectionFilterN)(&local_1288);
                      pSVar35 = (Scene *)CONCAT44(fStack_1294,local_1298);
                      pRVar34 = local_12c8;
                      context = (RayQueryContext *)local_12d4._4_8_;
                      if ((((RayK<1> *)local_1288.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00e7f34d;
LAB_00e7f433:
                      (ray->super_RayK<1>).tfar = (float)local_12a8._0_4_;
                      pRVar31 = (RayHit *)local_1288.valid;
                    }
                    local_12b8[(long)pRVar37] = 0.0;
                    fVar74 = (ray->super_RayK<1>).tfar;
                    local_12b8[0] = (float)(-(uint)(auVar135._0_4_ <= fVar74) & (uint)local_12b8[0])
                    ;
                    local_12b8[1] = (float)(-(uint)(auVar135._4_4_ <= fVar74) & (uint)local_12b8[1])
                    ;
                    uStack_12b0 = -(uint)(auVar135._8_4_ <= fVar74) & uStack_12b0;
                    uStack_12ac = -(uint)(auVar135._12_4_ <= fVar74) & uStack_12ac;
                  }
                  auVar24._4_4_ = local_12b8[1];
                  auVar24._0_4_ = local_12b8[0];
                  auVar24._8_4_ = uStack_12b0;
                  auVar24._12_4_ = uStack_12ac;
                  uVar33 = (undefined4)((ulong)pRVar31 >> 0x20);
                  uVar27 = movmskps((int)pRVar31,auVar24);
                  if (uVar27 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = (RayQueryContext *)local_12d4._4_8_;
                  pRVar37 = (RayHit *)local_1288.valid;
                } while( true );
              }
            }
            fVar74 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar107 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar83 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_10a8 = *(float *)(lVar13 + 0x60) - fVar74;
            fStack_10a4 = *(float *)(lVar13 + 100) - fVar74;
            fStack_10a0 = *(float *)(lVar13 + 0x68) - fVar74;
            fStack_109c = *(float *)(lVar13 + 0x6c) - fVar74;
            local_10b8 = *(float *)(lVar13 + 0x70) - fVar107;
            fStack_10b4 = *(float *)(lVar13 + 0x74) - fVar107;
            fStack_10b0 = *(float *)(lVar13 + 0x78) - fVar107;
            fStack_10ac = *(float *)(lVar13 + 0x7c) - fVar107;
            local_1228 = *(float *)(lVar13 + 0x80) - fVar83;
            fStack_1224 = *(float *)(lVar13 + 0x84) - fVar83;
            fStack_1220 = *(float *)(lVar13 + 0x88) - fVar83;
            fStack_121c = *(float *)(lVar13 + 0x8c) - fVar83;
            fVar41 = *(float *)(lVar13 + 0x90) - fVar74;
            fVar71 = *(float *)(lVar13 + 0x94) - fVar74;
            fVar81 = *(float *)(lVar13 + 0x98) - fVar74;
            fVar95 = *(float *)(lVar13 + 0x9c) - fVar74;
            fVar42 = *(float *)(lVar13 + 0xa0) - fVar107;
            fVar72 = *(float *)(lVar13 + 0xa4) - fVar107;
            fVar82 = *(float *)(lVar13 + 0xa8) - fVar107;
            fVar96 = *(float *)(lVar13 + 0xac) - fVar107;
            fVar69 = *(float *)(lVar13 + 0xb0) - fVar83;
            fVar73 = *(float *)(lVar13 + 0xb4) - fVar83;
            fVar84 = *(float *)(lVar13 + 0xb8) - fVar83;
            fVar98 = *(float *)(lVar13 + 0xbc) - fVar83;
            fVar127 = *(float *)(lVar13 + 0x30) - fVar74;
            fVar128 = *(float *)(lVar13 + 0x34) - fVar74;
            fVar132 = *(float *)(lVar13 + 0x38) - fVar74;
            fVar74 = *(float *)(lVar13 + 0x3c) - fVar74;
            fVar115 = *(float *)(lVar13 + 0x40) - fVar107;
            fVar116 = *(float *)(lVar13 + 0x44) - fVar107;
            fVar121 = *(float *)(lVar13 + 0x48) - fVar107;
            fVar107 = *(float *)(lVar13 + 0x4c) - fVar107;
            fVar106 = *(float *)(lVar13 + 0x50) - fVar83;
            fVar108 = *(float *)(lVar13 + 0x54) - fVar83;
            fVar114 = *(float *)(lVar13 + 0x58) - fVar83;
            fVar83 = *(float *)(lVar13 + 0x5c) - fVar83;
            local_10c8 = fVar127 - local_10a8;
            fStack_10c4 = fVar128 - fStack_10a4;
            fStack_10c0 = fVar132 - fStack_10a0;
            fStack_10bc = fVar74 - fStack_109c;
            local_10e8 = fVar115 - local_10b8;
            fStack_10e4 = fVar116 - fStack_10b4;
            fStack_10e0 = fVar121 - fStack_10b0;
            fStack_10dc = fVar107 - fStack_10ac;
            local_10d8 = fVar106 - local_1228;
            fStack_10d4 = fVar108 - fStack_1224;
            fStack_10d0 = fVar114 - fStack_1220;
            fStack_10cc = fVar83 - fStack_121c;
            fVar97 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_12a8._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar129 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_12a8._0_4_ = local_12a8._4_4_;
            fStack_12a0 = (float)local_12a8._4_4_;
            fStack_129c = (float)local_12a8._4_4_;
            fVar144 = (local_10e8 * (local_1228 + fVar106) - (local_10b8 + fVar115) * local_10d8) *
                      fVar97 + ((local_10a8 + fVar127) * local_10d8 -
                               (local_1228 + fVar106) * local_10c8) * (float)local_12a8._4_4_ +
                               (local_10c8 * (local_10b8 + fVar115) -
                               (local_10a8 + fVar127) * local_10e8) * fVar129;
            fVar147 = (fStack_10e4 * (fStack_1224 + fVar108) - (fStack_10b4 + fVar116) * fStack_10d4
                      ) * fVar97 +
                      ((fStack_10a4 + fVar128) * fStack_10d4 - (fStack_1224 + fVar108) * fStack_10c4
                      ) * (float)local_12a8._4_4_ +
                      (fStack_10c4 * (fStack_10b4 + fVar116) - (fStack_10a4 + fVar128) * fStack_10e4
                      ) * fVar129;
            local_1208._0_8_ = CONCAT44(fVar147,fVar144);
            local_1208._8_4_ =
                 (fStack_10e0 * (fStack_1220 + fVar114) - (fStack_10b0 + fVar121) * fStack_10d0) *
                 fVar97 + ((fStack_10a0 + fVar132) * fStack_10d0 -
                          (fStack_1220 + fVar114) * fStack_10c0) * (float)local_12a8._4_4_ +
                          (fStack_10c0 * (fStack_10b0 + fVar121) -
                          (fStack_10a0 + fVar132) * fStack_10e0) * fVar129;
            fStack_11fc = (fStack_10dc * (fStack_121c + fVar83) -
                          (fStack_10ac + fVar107) * fStack_10cc) * fVar97 +
                          ((fStack_109c + fVar74) * fStack_10cc -
                          (fStack_121c + fVar83) * fStack_10bc) * (float)local_12a8._4_4_ +
                          (fStack_10bc * (fStack_10ac + fVar107) -
                          (fStack_109c + fVar74) * fStack_10dc) * fVar129;
            fVar148 = local_10a8 - fVar41;
            fVar149 = fStack_10a4 - fVar71;
            fVar150 = fStack_10a0 - fVar81;
            fVar151 = fStack_109c - fVar95;
            fVar133 = local_10b8 - fVar42;
            fVar134 = fStack_10b4 - fVar72;
            fVar137 = fStack_10b0 - fVar82;
            fVar141 = fStack_10ac - fVar96;
            fVar70 = local_1228 - fVar69;
            fVar75 = fStack_1224 - fVar73;
            fVar94 = fStack_1220 - fVar84;
            fVar105 = fStack_121c - fVar98;
            local_1108._0_4_ =
                 (fVar133 * (local_1228 + fVar69) - (local_10b8 + fVar42) * fVar70) * fVar97 +
                 ((local_10a8 + fVar41) * fVar70 - (local_1228 + fVar69) * fVar148) *
                 (float)local_12a8._4_4_ +
                 (fVar148 * (local_10b8 + fVar42) - (local_10a8 + fVar41) * fVar133) * fVar129;
            local_1108._4_4_ =
                 (fVar134 * (fStack_1224 + fVar73) - (fStack_10b4 + fVar72) * fVar75) * fVar97 +
                 ((fStack_10a4 + fVar71) * fVar75 - (fStack_1224 + fVar73) * fVar149) *
                 (float)local_12a8._4_4_ +
                 (fVar149 * (fStack_10b4 + fVar72) - (fStack_10a4 + fVar71) * fVar134) * fVar129;
            local_1108._8_4_ =
                 (fVar137 * (fStack_1220 + fVar84) - (fStack_10b0 + fVar82) * fVar94) * fVar97 +
                 ((fStack_10a0 + fVar81) * fVar94 - (fStack_1220 + fVar84) * fVar150) *
                 (float)local_12a8._4_4_ +
                 (fVar150 * (fStack_10b0 + fVar82) - (fStack_10a0 + fVar81) * fVar137) * fVar129;
            local_1108._12_4_ =
                 (fVar141 * (fStack_121c + fVar98) - (fStack_10ac + fVar96) * fVar105) * fVar97 +
                 ((fStack_109c + fVar95) * fVar105 - (fStack_121c + fVar98) * fVar151) *
                 (float)local_12a8._4_4_ +
                 (fVar151 * (fStack_10ac + fVar96) - (fStack_109c + fVar95) * fVar141) * fVar129;
            local_1128 = fVar41 - fVar127;
            fStack_1124 = fVar71 - fVar128;
            fStack_1120 = fVar81 - fVar132;
            fStack_111c = fVar95 - fVar74;
            local_1118 = fVar42 - fVar115;
            fStack_1114 = fVar72 - fVar116;
            fStack_1110 = fVar82 - fVar121;
            fStack_110c = fVar96 - fVar107;
            fVar125 = fVar69 - fVar106;
            fVar126 = fVar73 - fVar108;
            uStack_12c0 = fVar84 - fVar114;
            uStack_12bc = fVar98 - fVar83;
            local_12c8 = (RayHit *)CONCAT44(fVar126,fVar125);
            auVar123._0_4_ =
                 (local_1118 * (fVar106 + fVar69) - (fVar115 + fVar42) * fVar125) * fVar97 +
                 ((fVar127 + fVar41) * fVar125 - (fVar106 + fVar69) * local_1128) *
                 (float)local_12a8._4_4_ +
                 (local_1128 * (fVar115 + fVar42) - (fVar127 + fVar41) * local_1118) * fVar129;
            auVar123._4_4_ =
                 (fStack_1114 * (fVar108 + fVar73) - (fVar116 + fVar72) * fVar126) * fVar97 +
                 ((fVar128 + fVar71) * fVar126 - (fVar108 + fVar73) * fStack_1124) *
                 (float)local_12a8._4_4_ +
                 (fStack_1124 * (fVar116 + fVar72) - (fVar128 + fVar71) * fStack_1114) * fVar129;
            auVar123._8_4_ =
                 (fStack_1110 * (fVar114 + fVar84) - (fVar121 + fVar82) * (float)uStack_12c0) *
                 fVar97 + ((fVar132 + fVar81) * (float)uStack_12c0 -
                          (fVar114 + fVar84) * fStack_1120) * (float)local_12a8._4_4_ +
                          (fStack_1120 * (fVar121 + fVar82) - (fVar132 + fVar81) * fStack_1110) *
                          fVar129;
            auVar123._12_4_ =
                 (fStack_110c * (fVar83 + fVar98) - (fVar107 + fVar96) * (float)uStack_12bc) *
                 fVar97 + ((fVar74 + fVar95) * (float)uStack_12bc - (fVar83 + fVar98) * fStack_111c)
                          * (float)local_12a8._4_4_ +
                          (fStack_111c * (fVar107 + fVar96) - (fVar74 + fVar95) * fStack_110c) *
                          fVar129;
            local_1298 = local_1108._0_4_ + fVar144 + auVar123._0_4_;
            fStack_1294 = local_1108._4_4_ + fVar147 + auVar123._4_4_;
            fStack_1290 = local_1108._8_4_ + (float)local_1208._8_4_ + auVar123._8_4_;
            fStack_128c = local_1108._12_4_ + fStack_11fc + auVar123._12_4_;
            auVar60._8_4_ = local_1208._8_4_;
            auVar60._0_8_ = local_1208._0_8_;
            auVar60._12_4_ = fStack_11fc;
            auVar139 = minps(auVar60,local_1108);
            auVar139 = minps(auVar139,auVar123);
            fStack_10f0 = (float)local_1208._8_4_;
            local_10f8 = (undefined1  [8])local_1208._0_8_;
            fStack_10ec = fStack_11fc;
            auVar103._8_4_ = local_1208._8_4_;
            auVar103._0_8_ = local_1208._0_8_;
            auVar103._12_4_ = fStack_11fc;
            auVar138 = maxps(auVar103,local_1108);
            auVar138 = maxps(auVar138,auVar123);
            fVar74 = ABS(local_1298) * 1.1920929e-07;
            fVar107 = ABS(fStack_1294) * 1.1920929e-07;
            fVar83 = ABS(fStack_1290) * 1.1920929e-07;
            fVar41 = ABS(fStack_128c) * 1.1920929e-07;
            auVar104._4_4_ = -(uint)(auVar138._4_4_ <= fVar107);
            auVar104._0_4_ = -(uint)(auVar138._0_4_ <= fVar74);
            auVar104._8_4_ = -(uint)(auVar138._8_4_ <= fVar83);
            auVar104._12_4_ = -(uint)(auVar138._12_4_ <= fVar41);
            auVar61._4_4_ = -(uint)(-fVar107 <= auVar139._4_4_);
            auVar61._0_4_ = -(uint)(-fVar74 <= auVar139._0_4_);
            auVar61._8_4_ = -(uint)(-fVar83 <= auVar139._8_4_);
            auVar61._12_4_ = -(uint)(-fVar41 <= auVar139._12_4_);
            auVar104 = auVar104 | auVar61;
            iVar28 = movmskps(uVar27,auVar104);
            if (iVar28 != 0) {
              auVar113._0_4_ = local_10e8 * fVar70 - fVar133 * local_10d8;
              auVar113._4_4_ = fStack_10e4 * fVar75 - fVar134 * fStack_10d4;
              auVar113._8_4_ = fStack_10e0 * fVar94 - fVar137 * fStack_10d0;
              auVar113._12_4_ = fStack_10dc * fVar105 - fVar141 * fStack_10cc;
              auVar140._0_4_ = fVar133 * fVar125 - fVar70 * local_1118;
              auVar140._4_4_ = fVar134 * fVar126 - fVar75 * fStack_1114;
              auVar140._8_4_ = fVar137 * (float)uStack_12c0 - fVar94 * fStack_1110;
              auVar140._12_4_ = fVar141 * (float)uStack_12bc - fVar105 * fStack_110c;
              auVar62._4_4_ = -(uint)(ABS(fVar134 * fStack_10d4) < ABS(fVar75 * fStack_1114));
              auVar62._0_4_ = -(uint)(ABS(fVar133 * local_10d8) < ABS(fVar70 * local_1118));
              auVar62._8_4_ = -(uint)(ABS(fVar137 * fStack_10d0) < ABS(fVar94 * fStack_1110));
              auVar62._12_4_ = -(uint)(ABS(fVar141 * fStack_10cc) < ABS(fVar105 * fStack_110c));
              local_11d8 = blendvps(auVar140,auVar113,auVar62);
              auVar146._0_4_ = fVar70 * local_1128 - fVar148 * fVar125;
              auVar146._4_4_ = fVar75 * fStack_1124 - fVar149 * fVar126;
              auVar146._8_4_ = fVar94 * fStack_1120 - fVar150 * (float)uStack_12c0;
              auVar146._12_4_ = fVar105 * fStack_111c - fVar151 * (float)uStack_12bc;
              auVar63._4_4_ = -(uint)(ABS(fVar75 * fStack_10c4) < ABS(fVar149 * fVar126));
              auVar63._0_4_ = -(uint)(ABS(fVar70 * local_10c8) < ABS(fVar148 * fVar125));
              auVar63._8_4_ = -(uint)(ABS(fVar94 * fStack_10c0) < ABS(fVar150 * (float)uStack_12c0))
              ;
              auVar63._12_4_ =
                   -(uint)(ABS(fVar105 * fStack_10bc) < ABS(fVar151 * (float)uStack_12bc));
              auVar21._4_4_ = fStack_10d4 * fVar149 - fVar75 * fStack_10c4;
              auVar21._0_4_ = local_10d8 * fVar148 - fVar70 * local_10c8;
              auVar21._8_4_ = fStack_10d0 * fVar150 - fVar94 * fStack_10c0;
              auVar21._12_4_ = fStack_10cc * fVar151 - fVar105 * fStack_10bc;
              local_11c8 = blendvps(auVar146,auVar21,auVar63);
              auVar120._0_4_ = fVar148 * local_1118 - fVar133 * local_1128;
              auVar120._4_4_ = fVar149 * fStack_1114 - fVar134 * fStack_1124;
              auVar120._8_4_ = fVar150 * fStack_1110 - fVar137 * fStack_1120;
              auVar120._12_4_ = fVar151 * fStack_110c - fVar141 * fStack_111c;
              auVar64._4_4_ = -(uint)(ABS(fVar149 * fStack_10e4) < ABS(fVar134 * fStack_1124));
              auVar64._0_4_ = -(uint)(ABS(fVar148 * local_10e8) < ABS(fVar133 * local_1128));
              auVar64._8_4_ = -(uint)(ABS(fVar150 * fStack_10e0) < ABS(fVar137 * fStack_1120));
              auVar64._12_4_ = -(uint)(ABS(fVar151 * fStack_10dc) < ABS(fVar141 * fStack_111c));
              auVar23._4_4_ = fStack_10c4 * fVar134 - fVar149 * fStack_10e4;
              auVar23._0_4_ = local_10c8 * fVar133 - fVar148 * local_10e8;
              auVar23._8_4_ = fStack_10c0 * fVar137 - fVar150 * fStack_10e0;
              auVar23._12_4_ = fStack_10bc * fVar141 - fVar151 * fStack_10dc;
              local_11b8 = blendvps(auVar120,auVar23,auVar64);
              fVar70 = fVar97 * local_11d8._0_4_ +
                       (float)local_12a8._4_4_ * local_11c8._0_4_ + fVar129 * local_11b8._0_4_;
              fVar71 = fVar97 * local_11d8._4_4_ +
                       (float)local_12a8._4_4_ * local_11c8._4_4_ + fVar129 * local_11b8._4_4_;
              fVar72 = fVar97 * local_11d8._8_4_ +
                       (float)local_12a8._4_4_ * local_11c8._8_4_ + fVar129 * local_11b8._8_4_;
              fVar73 = fVar97 * local_11d8._12_4_ +
                       (float)local_12a8._4_4_ * local_11c8._12_4_ + fVar129 * local_11b8._12_4_;
              fVar70 = fVar70 + fVar70;
              fVar71 = fVar71 + fVar71;
              fVar72 = fVar72 + fVar72;
              fVar73 = fVar73 + fVar73;
              auVar65._0_4_ = local_10b8 * local_11c8._0_4_ + local_1228 * local_11b8._0_4_;
              auVar65._4_4_ = fStack_10b4 * local_11c8._4_4_ + fStack_1224 * local_11b8._4_4_;
              auVar65._8_4_ = fStack_10b0 * local_11c8._8_4_ + fStack_1220 * local_11b8._8_4_;
              auVar65._12_4_ = fStack_10ac * local_11c8._12_4_ + fStack_121c * local_11b8._12_4_;
              fVar129 = local_10a8 * local_11d8._0_4_ + auVar65._0_4_;
              fVar41 = fStack_10a4 * local_11d8._4_4_ + auVar65._4_4_;
              fVar42 = fStack_10a0 * local_11d8._8_4_ + auVar65._8_4_;
              fVar69 = fStack_109c * local_11d8._12_4_ + auVar65._12_4_;
              auVar17._4_4_ = fVar71;
              auVar17._0_4_ = fVar70;
              auVar17._8_4_ = fVar72;
              auVar17._12_4_ = fVar73;
              auVar139 = rcpps(auVar65,auVar17);
              fVar74 = auVar139._0_4_;
              fVar107 = auVar139._4_4_;
              fVar83 = auVar139._8_4_;
              fVar97 = auVar139._12_4_;
              auVar131._0_4_ = ((1.0 - fVar70 * fVar74) * fVar74 + fVar74) * (fVar129 + fVar129);
              auVar131._4_4_ = ((1.0 - fVar71 * fVar107) * fVar107 + fVar107) * (fVar41 + fVar41);
              auVar131._8_4_ = ((1.0 - fVar72 * fVar83) * fVar83 + fVar83) * (fVar42 + fVar42);
              auVar131._12_4_ = ((1.0 - fVar73 * fVar97) * fVar97 + fVar97) * (fVar69 + fVar69);
              fVar74 = (ray->super_RayK<1>).tfar;
              fVar107 = (ray->super_RayK<1>).org.field_0.m128[3];
              local_11a8 = -(uint)(fVar70 != 0.0) & auVar104._0_4_ &
                           -(uint)(auVar131._0_4_ <= fVar74 && fVar107 <= auVar131._0_4_);
              fStack_11a4 = (float)(-(uint)(fVar71 != 0.0) & auVar104._4_4_ &
                                   -(uint)(auVar131._4_4_ <= fVar74 && fVar107 <= auVar131._4_4_));
              uStack_11a0 = -(uint)(fVar72 != 0.0) & auVar104._8_4_ &
                            -(uint)(auVar131._8_4_ <= fVar74 && fVar107 <= auVar131._8_4_);
              uStack_119c = -(uint)(fVar73 != 0.0) & auVar104._12_4_ &
                            -(uint)(auVar131._12_4_ <= fVar74 && fVar107 <= auVar131._12_4_);
              auVar18._4_4_ = fStack_11a4;
              auVar18._0_4_ = local_11a8;
              auVar18._8_4_ = uStack_11a0;
              auVar18._12_4_ = uStack_119c;
              iVar28 = movmskps(iVar28,auVar18);
              if (iVar28 != 0) {
                _local_11f8 = local_1108;
                local_11e8._4_4_ = fStack_1294;
                local_11e8._0_4_ = local_1298;
                local_11e8._8_4_ = fStack_1290;
                local_11e8._12_4_ = fStack_128c;
                local_1178 = auVar131;
                local_1138._8_8_ = uStack_fa0;
                local_1138._0_8_ = local_fa8;
                pSVar35 = context->scene;
                local_12b8[0] = (float)local_11a8;
                local_12b8[1] = fStack_11a4;
                uStack_12b0 = uStack_11a0;
                uStack_12ac = uStack_119c;
                auVar139 = rcpps(auVar104,local_11e8);
                fVar129 = auVar139._0_4_;
                fVar41 = auVar139._4_4_;
                fVar42 = auVar139._8_4_;
                fVar69 = auVar139._12_4_;
                fVar107 = (float)DAT_01feca10;
                fVar83 = DAT_01feca10._4_4_;
                fVar97 = DAT_01feca10._12_4_;
                fVar74 = DAT_01feca10._8_4_;
                fVar129 = (float)(-(uint)(1e-18 <= ABS(local_1298)) &
                                 (uint)((fVar107 - local_1298 * fVar129) * fVar129 + fVar129));
                fVar41 = (float)(-(uint)(1e-18 <= ABS(fStack_1294)) &
                                (uint)((fVar83 - fStack_1294 * fVar41) * fVar41 + fVar41));
                fVar42 = (float)(-(uint)(1e-18 <= ABS(fStack_1290)) &
                                (uint)((fVar74 - fStack_1290 * fVar42) * fVar42 + fVar42));
                fVar69 = (float)(-(uint)(1e-18 <= ABS(fStack_128c)) &
                                (uint)((fVar97 - fStack_128c * fVar69) * fVar69 + fVar69));
                auVar124._0_4_ = fVar144 * fVar129;
                auVar124._4_4_ = fVar147 * fVar41;
                auVar124._8_4_ = (float)local_1208._8_4_ * fVar42;
                auVar124._12_4_ = fStack_11fc * fVar69;
                auVar139 = minps(auVar124,_DAT_01feca10);
                auVar136._0_4_ = fVar129 * local_1108._0_4_;
                auVar136._4_4_ = fVar41 * local_1108._4_4_;
                auVar136._8_4_ = fVar42 * local_1108._8_4_;
                auVar136._12_4_ = fVar69 * local_1108._12_4_;
                auVar138 = minps(auVar136,_DAT_01feca10);
                auVar80._0_4_ = fVar107 - auVar139._0_4_;
                auVar80._4_4_ = fVar83 - auVar139._4_4_;
                auVar80._8_4_ = fVar74 - auVar139._8_4_;
                auVar80._12_4_ = fVar97 - auVar139._12_4_;
                auVar92._0_4_ = fVar107 - auVar138._0_4_;
                auVar92._4_4_ = fVar83 - auVar138._4_4_;
                auVar92._8_4_ = fVar74 - auVar138._8_4_;
                auVar92._12_4_ = fVar97 - auVar138._12_4_;
                local_1198 = blendvps(auVar139,auVar80,local_1138);
                local_1188 = blendvps(auVar138,auVar92,local_1138);
                local_1168 = local_11d8;
                local_1158 = local_11c8;
                local_1148 = local_11b8;
                auVar66._4_4_ = fStack_11a4;
                auVar66._0_4_ = local_11a8;
                auVar66._8_4_ = uStack_11a0;
                auVar66._12_4_ = uStack_119c;
                auVar138 = blendvps(_DAT_01feb9f0,auVar131,auVar66);
                auVar93._4_4_ = auVar138._0_4_;
                auVar93._0_4_ = auVar138._4_4_;
                auVar93._8_4_ = auVar138._12_4_;
                auVar93._12_4_ = auVar138._8_4_;
                auVar139 = minps(auVar93,auVar138);
                auVar67._0_8_ = auVar139._8_8_;
                auVar67._8_4_ = auVar139._0_4_;
                auVar67._12_4_ = auVar139._4_4_;
                auVar139 = minps(auVar67,auVar139);
                auVar68._0_4_ = -(uint)(auVar139._0_4_ == auVar138._0_4_) & local_11a8;
                auVar68._4_4_ =
                     (float)(-(uint)(auVar139._4_4_ == auVar138._4_4_) & (uint)fStack_11a4);
                auVar68._8_4_ = -(uint)(auVar139._8_4_ == auVar138._8_4_) & uStack_11a0;
                auVar68._12_4_ = -(uint)(auVar139._12_4_ == auVar138._12_4_) & uStack_119c;
                iVar28 = movmskps(iVar28,auVar68);
                uVar27 = local_11a8;
                fVar74 = fStack_11a4;
                uVar142 = uStack_11a0;
                uVar143 = uStack_119c;
                if (iVar28 != 0) {
                  uVar27 = auVar68._0_4_;
                  fVar74 = auVar68._4_4_;
                  uVar142 = auVar68._8_4_;
                  uVar143 = auVar68._12_4_;
                }
                auVar19._4_4_ = fVar74;
                auVar19._0_4_ = uVar27;
                auVar19._8_4_ = uVar142;
                auVar19._12_4_ = uVar143;
                uVar29 = movmskps(iVar28,auVar19);
                pRVar37 = (RayHit *)0x0;
                if (CONCAT44(uVar33,uVar29) != 0) {
                  for (; (CONCAT44(uVar33,uVar29) >> (long)pRVar37 & 1) == 0;
                      pRVar37 = (RayHit *)((long)(pRVar37->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar27 = *(uint *)(lVar13 + 0xc0 + (long)pRVar37 * 4);
                  pGVar10 = (pSVar35->geometries).items[uVar27].ptr;
                  if ((pGVar10->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_12b8[(long)pRVar37] = 0.0;
                  }
                  else {
                    pRVar11 = context->args;
                    if ((pRVar11->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar74 = *(float *)(local_1198 + (long)pRVar37 * 4);
                      fVar107 = *(float *)(local_1188 + (long)pRVar37 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1178 + (long)pRVar37 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1168 + (long)pRVar37 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1158 + (long)pRVar37 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_1148 + (long)pRVar37 * 4);
                      ray->u = fVar74;
                      ray->v = fVar107;
                      ray->primID = *(uint *)((long)&local_1218 + (long)pRVar37 * 4);
                      ray->geomID = uVar27;
                      pRVar12 = context->user;
                      ray->instID[0] = pRVar12->instID[0];
                      ray->instPrimID[0] = pRVar12->instPrimID[0];
                      break;
                    }
                    local_1288.context = context->user;
                    local_1258 = *(float *)(local_1168 + (long)pRVar37 * 4);
                    local_1254 = *(undefined4 *)(local_1158 + (long)pRVar37 * 4);
                    local_1250 = *(undefined4 *)(local_1148 + (long)pRVar37 * 4);
                    local_124c = *(undefined4 *)(local_1198 + (long)pRVar37 * 4);
                    local_1248 = *(undefined4 *)(local_1188 + (long)pRVar37 * 4);
                    local_1244 = *(undefined4 *)((long)&local_1218 + (long)pRVar37 * 4);
                    local_1240 = uVar27;
                    local_123c = (local_1288.context)->instID[0];
                    local_1238 = (local_1288.context)->instPrimID[0];
                    local_12a8._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1178 + (long)pRVar37 * 4);
                    local_12d4._0_4_ = -NAN;
                    local_1288.valid = (int *)local_12d4;
                    local_1288.geometryUserPtr = pGVar10->userPtr;
                    local_1288.ray = (RTCRayN *)ray;
                    local_1288.hit = (RTCHitN *)&local_1258;
                    local_1288.N = 1;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e7fb90:
                      if (pRVar11->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar11->filter)(&local_1288);
                          context = (RayQueryContext *)local_12d4._4_8_;
                        }
                        if ((((RayK<1> *)local_1288.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00e7fc76;
                      }
                      (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1288.hit;
                      (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1288.hit + 4);
                      (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1288.hit + 8);
                      *(float *)((long)local_1288.ray + 0x3c) = *(float *)(local_1288.hit + 0xc);
                      *(float *)((long)local_1288.ray + 0x40) = *(float *)(local_1288.hit + 0x10);
                      *(float *)((long)local_1288.ray + 0x44) = *(float *)(local_1288.hit + 0x14);
                      *(float *)((long)local_1288.ray + 0x48) = *(float *)(local_1288.hit + 0x18);
                      *(float *)((long)local_1288.ray + 0x4c) = *(float *)(local_1288.hit + 0x1c);
                      *(float *)((long)local_1288.ray + 0x50) = *(float *)(local_1288.hit + 0x20);
                      pRVar31 = (RayHit *)local_1288.ray;
                    }
                    else {
                      local_1298 = SUB84(pSVar35,0);
                      fStack_1294 = (float)((ulong)pSVar35 >> 0x20);
                      local_12c8 = pRVar34;
                      (*pGVar10->intersectionFilterN)(&local_1288);
                      pSVar35 = (Scene *)CONCAT44(fStack_1294,local_1298);
                      pRVar34 = local_12c8;
                      context = (RayQueryContext *)local_12d4._4_8_;
                      if ((((RayK<1> *)local_1288.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00e7fb90;
LAB_00e7fc76:
                      (ray->super_RayK<1>).tfar = (float)local_12a8._0_4_;
                      pRVar31 = (RayHit *)local_1288.valid;
                    }
                    uVar27 = (uint)pRVar31;
                    local_12b8[(long)pRVar37] = 0.0;
                    fVar74 = (ray->super_RayK<1>).tfar;
                    local_12b8[0] = (float)(-(uint)(auVar131._0_4_ <= fVar74) & (uint)local_12b8[0])
                    ;
                    local_12b8[1] = (float)(-(uint)(auVar131._4_4_ <= fVar74) & (uint)local_12b8[1])
                    ;
                    uStack_12b0 = -(uint)(auVar131._8_4_ <= fVar74) & uStack_12b0;
                    uStack_12ac = -(uint)(auVar131._12_4_ <= fVar74) & uStack_12ac;
                  }
                  auVar25._4_4_ = local_12b8[1];
                  auVar25._0_4_ = local_12b8[0];
                  auVar25._8_4_ = uStack_12b0;
                  auVar25._12_4_ = uStack_12ac;
                  iVar28 = movmskps(uVar27,auVar25);
                  if (iVar28 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = (RayQueryContext *)local_12d4._4_8_;
                  pRVar37 = (RayHit *)local_1288.valid;
                } while( true );
              }
            }
            local_1050 = local_1050 + 1;
          } while (local_1050 != local_1078);
        }
        fVar83 = (ray->super_RayK<1>).tfar;
        uVar32 = local_1088;
        uVar40 = local_1090;
        fVar74 = fVar83;
        fVar107 = fVar83;
        fVar97 = fVar83;
        auVar139 = local_fc8;
        fVar129 = local_fe8;
        fVar41 = fStack_fe4;
        fVar42 = fStack_fe0;
        fVar69 = fStack_fdc;
        fVar70 = local_1008;
        fVar71 = fStack_1004;
        fVar72 = fStack_1000;
        fVar73 = fStack_ffc;
        fVar75 = local_1018;
        fVar81 = fStack_1014;
        fVar82 = fStack_1010;
        fVar84 = fStack_100c;
        fVar94 = local_1028;
        fVar95 = fStack_1024;
        fVar96 = fStack_1020;
        fVar98 = fStack_101c;
        fVar105 = local_1038;
        fVar106 = fStack_1034;
        fVar108 = fStack_1030;
        fVar114 = fStack_102c;
        fVar115 = local_1048;
        fVar116 = fStack_1044;
        fVar121 = fStack_1040;
        fVar125 = fStack_103c;
        fVar126 = local_fb8;
        fVar127 = fStack_fb4;
        fVar128 = fStack_fb0;
        fVar132 = fStack_fac;
        fVar133 = local_fd8;
        fVar134 = fStack_fd4;
        fVar137 = fStack_fd0;
        fVar141 = fStack_fcc;
        fVar144 = local_ff8;
        fVar147 = fStack_ff4;
        fVar148 = fStack_ff0;
        fVar149 = fStack_fec;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }